

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleBenchmark.cpp
# Opt level: O0

int * beagle::benchmark::getRandomTipStates(int nsites,int stateCount,uint *seed)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  int in_EDI;
  int s;
  int i;
  int *states;
  int local_1c;
  
  piVar2 = (int *)calloc(4,(long)in_EDI);
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    iVar1 = gt_rand((uint *)0x12b951);
    piVar2[local_1c] = iVar1 % in_ESI;
  }
  return piVar2;
}

Assistant:

int* getRandomTipStates( int nsites, int stateCount, unsigned int *seed )
{
    int *states = (int*) calloc(sizeof(int), nsites);
    for( int i=0; i<nsites; i++ )
    {
        int s = gt_rand(seed)%stateCount;
        states[i]=s;
    }
    return states;
}